

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall
ON_SubDFace::ReplaceEdgeInArray
          (ON_SubDFace *this,uint fei0,ON_SubDEdge *edge_to_remove,ON_SubDEdgePtr edgeptr_to_insert)

{
  ON_SubDEdgePtr *pOVar1;
  uint uVar2;
  
  pOVar1 = this->m_edge4;
  uVar2 = 0;
  while( true ) {
    if (this->m_edge_count == uVar2) {
      return false;
    }
    if (uVar2 == 4) {
      pOVar1 = this->m_edgex;
    }
    if (uVar2 == 4 && this->m_edgex == (ON_SubDEdgePtr *)0x0) break;
    if ((fei0 <= uVar2) && ((ON_SubDEdge *)(pOVar1->m_ptr & 0xfffffffffffffff8) == edge_to_remove))
    {
      pOVar1->m_ptr = edgeptr_to_insert.m_ptr;
      return true;
    }
    uVar2 = uVar2 + 1;
    pOVar1 = pOVar1 + 1;
  }
  return false;
}

Assistant:

bool ON_SubDFace::ReplaceEdgeInArray(
  unsigned int fei0,
  ON_SubDEdge* edge_to_remove,
  ON_SubDEdgePtr edgeptr_to_insert
)
{
  const unsigned int face_edge_count = m_edge_count;
  ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned int fei = 0; fei < face_edge_count; fei++, eptr++)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    if (fei >= fei0 && edge_to_remove == eptr->Edge() )
    {
      *eptr = edgeptr_to_insert;
      return true;
    }
  }
  return false;
}